

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Spinner.H
# Opt level: O1

int __thiscall Fl_Spinner::handle(Fl_Spinner *this,int event)

{
  int iVar1;
  uint uVar2;
  void *arg;
  Fl_Widget *this_00;
  
  if (event == 6) {
    iVar1 = Fl_Widget::take_focus((Fl_Widget *)&this->input_);
    uVar2 = (uint)(iVar1 != 0);
  }
  else {
    if ((event != 0xc) && (event != 8)) {
      iVar1 = Fl_Group::handle(&this->super_Fl_Group,event);
      return iVar1;
    }
    if (Fl::e_keysym == 0xff54) {
      arg = (this->down_button_).super_Fl_Button.super_Fl_Widget.user_data_;
      this_00 = (Fl_Widget *)&this->down_button_;
    }
    else {
      if (Fl::e_keysym != 0xff52) {
        return 0;
      }
      arg = (this->up_button_).super_Fl_Button.super_Fl_Widget.user_data_;
      this_00 = (Fl_Widget *)&this->up_button_;
    }
    Fl_Widget::do_callback(this_00,this_00,arg);
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int		handle(int event) {
		  switch (event) {
		    case FL_KEYDOWN :
		    case FL_SHORTCUT :
		      if (Fl::event_key() == FL_Up) {
			up_button_.do_callback();
			return 1;
		      } else if (Fl::event_key() == FL_Down) {
			down_button_.do_callback();
			return 1;
		      } else return 0;

		    case FL_FOCUS :
		      if (input_.take_focus()) return 1;
		      else return 0;
		  }

		  return Fl_Group::handle(event);
		}